

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamCompAddStep(xmlStreamCompPtr comp,xmlChar *name,xmlChar *ns,int nodeType,int flags)

{
  int iVar1;
  xmlStreamStepPtr pxVar2;
  xmlStreamStepPtr cur;
  int flags_local;
  int nodeType_local;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlStreamCompPtr comp_local;
  
  if (comp->maxStep <= comp->nbStep) {
    pxVar2 = (xmlStreamStepPtr)(*xmlRealloc)(comp->steps,(long)(comp->maxStep << 1) << 5);
    if (pxVar2 == (xmlStreamStepPtr)0x0) {
      return -1;
    }
    comp->steps = pxVar2;
    comp->maxStep = comp->maxStep << 1;
  }
  iVar1 = comp->nbStep;
  comp->nbStep = iVar1 + 1;
  pxVar2 = comp->steps + iVar1;
  pxVar2->flags = flags;
  pxVar2->name = name;
  pxVar2->ns = ns;
  pxVar2->nodeType = nodeType;
  return comp->nbStep + -1;
}

Assistant:

static int
xmlStreamCompAddStep(xmlStreamCompPtr comp, const xmlChar *name,
                     const xmlChar *ns, int nodeType, int flags) {
    xmlStreamStepPtr cur;

    if (comp->nbStep >= comp->maxStep) {
	cur = (xmlStreamStepPtr) xmlRealloc(comp->steps,
				 comp->maxStep * 2 * sizeof(xmlStreamStep));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamComp: malloc failed\n");
	    return(-1);
	}
	comp->steps = cur;
        comp->maxStep *= 2;
    }
    cur = &comp->steps[comp->nbStep++];
    cur->flags = flags;
    cur->name = name;
    cur->ns = ns;
    cur->nodeType = nodeType;
    return(comp->nbStep - 1);
}